

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_HTMLtree(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  xmlDocPtr pxVar11;
  xmlDocPtr pxVar12;
  ulong uVar13;
  htmlDocPtr pxVar14;
  xmlBufferPtr pxVar15;
  xmlDocPtr pxVar16;
  FILE *pFVar17;
  long lVar18;
  undefined4 uVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  undefined8 uVar20;
  int n_format;
  uint uVar21;
  int iVar22;
  undefined *puVar23;
  int n_cur;
  undefined4 *puVar24;
  xmlDocPtr in_RSI;
  int n_format_1;
  uint uVar25;
  undefined8 *puVar26;
  int n_encoding;
  int n_size;
  bool bVar27;
  int test_ret_6;
  int test_ret_4;
  int test_ret_1;
  int test_ret;
  int test_ret_2;
  int test_ret_3;
  int test_ret_10;
  int test_ret_9;
  ulong local_68;
  ulong local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing HTMLtree : 18 of 18 functions ...");
  }
  iVar1 = 0;
  local_60 = 0;
  do {
    uVar4 = 0;
    do {
      uVar13 = 0;
      do {
        puVar24 = &DAT_00157254;
        pxVar12 = (xmlDocPtr)0x0;
        do {
          iVar3 = (int)in_RSI;
          iVar2 = xmlMemBlocks();
          if ((int)local_60 == 0) {
            iVar3 = 0;
            lVar18 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            lVar18 = 0;
          }
          pxVar11 = gen_xmlDocPtr(uVar4,iVar3);
          if ((uint)uVar13 < 3) {
            uVar20 = (&DAT_00159d48)[uVar13];
          }
          else {
            uVar20 = 0;
          }
          uVar19 = 0xffffffff;
          uVar21 = (uint)pxVar12;
          if (uVar21 < 4) {
            uVar19 = *puVar24;
          }
          in_RSI = pxVar11;
          htmlDocContentDumpFormatOutput(lVar18,pxVar11,uVar20,uVar19);
          call_tests = call_tests + 1;
          if (lVar18 != 0) {
            xmlOutputBufferClose(lVar18);
          }
          if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
            xmlFreeDoc(pxVar11);
          }
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlDocContentDumpFormatOutput",
                   (ulong)(uint)(iVar3 - iVar2));
            iVar1 = iVar1 + 1;
            printf(" %d",local_60);
            printf(" %d",(ulong)uVar4);
            printf(" %d",uVar13);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar12;
          }
          uVar21 = uVar21 + 1;
          pxVar12 = (xmlDocPtr)(ulong)uVar21;
          puVar24 = puVar24 + 1;
        } while (uVar21 != 4);
        uVar21 = (uint)uVar13 + 1;
        uVar13 = (ulong)uVar21;
      } while (uVar21 != 4);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    bVar27 = (int)local_60 == 0;
    local_60 = (ulong)((int)local_60 + 1);
  } while (bVar27);
  function_tests = function_tests + 1;
  local_54 = 0;
  local_68 = 0;
  do {
    uVar4 = 0;
    do {
      pxVar12 = (xmlDocPtr)0x0;
      puVar26 = &DAT_00159d48;
      do {
        iVar3 = (int)in_RSI;
        iVar2 = xmlMemBlocks();
        if ((int)local_68 == 0) {
          iVar3 = 0;
          lVar18 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          lVar18 = 0;
        }
        pxVar11 = gen_xmlDocPtr(uVar4,iVar3);
        uVar21 = (uint)pxVar12;
        if (uVar21 < 3) {
          uVar20 = *puVar26;
        }
        else {
          uVar20 = 0;
        }
        in_RSI = pxVar11;
        htmlDocContentDumpOutput(lVar18,pxVar11,uVar20);
        call_tests = call_tests + 1;
        if (lVar18 != 0) {
          xmlOutputBufferClose(lVar18);
        }
        if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
          xmlFreeDoc(pxVar11);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlDocContentDumpOutput",(ulong)(uint)(iVar3 - iVar2))
          ;
          local_54 = local_54 + 1;
          printf(" %d",local_68);
          printf(" %d",(ulong)uVar4);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar12;
        }
        uVar21 = uVar21 + 1;
        pxVar12 = (xmlDocPtr)(ulong)uVar21;
        puVar26 = puVar26 + 1;
      } while (uVar21 != 4);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    bVar27 = (int)local_68 == 0;
    local_68 = (ulong)((int)local_68 + 1);
  } while (bVar27);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar4 = 0;
  do {
    uVar21 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      if (uVar4 == 0) {
        iVar5 = 0x14bac0;
        pFVar17 = fopen64("test.out","a+");
      }
      else {
        pFVar17 = (FILE *)0x0;
      }
      pxVar12 = gen_xmlDocPtr(uVar21,iVar5);
      in_RSI = pxVar12;
      htmlDocDump(pFVar17);
      call_tests = call_tests + 1;
      if (pFVar17 != (FILE *)0x0) {
        fclose(pFVar17);
      }
      if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
        xmlFreeDoc(pxVar12);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar3 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlDocDump",(ulong)(uint)(iVar5 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar4);
        in_RSI = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    bVar27 = uVar4 == 0;
    uVar4 = uVar4 + 1;
  } while (bVar27);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar4 = 0;
  do {
    uVar21 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      pxVar12 = gen_xmlDocPtr(uVar4,iVar5);
      uVar20 = 0;
      if (uVar21 == 0) {
        uVar20 = 0x15c438;
      }
      in_RSI = (xmlDocPtr)0x0;
      htmlDocDumpMemory(pxVar12,0,uVar20);
      call_tests = call_tests + 1;
      if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
        xmlFreeDoc(pxVar12);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar3 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlDocDumpMemory",(ulong)(uint)(iVar5 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar4);
        printf(" %d",0);
        in_RSI = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 == 1);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar4 = 0;
  do {
    uVar13 = 0;
    do {
      pxVar12 = (xmlDocPtr)0x0;
      iVar5 = (int)uVar13;
      uVar20 = 0;
      if (iVar5 == 0) {
        uVar20 = 0x15c438;
      }
      puVar24 = &DAT_00157254;
      do {
        iVar7 = (int)in_RSI;
        iVar6 = xmlMemBlocks();
        pxVar11 = gen_xmlDocPtr(uVar4,iVar7);
        uVar19 = 0xffffffff;
        uVar21 = (uint)pxVar12;
        if (uVar21 < 4) {
          uVar19 = *puVar24;
        }
        in_RSI = (xmlDocPtr)0x0;
        htmlDocDumpMemoryFormat(pxVar11,0,uVar20,uVar19);
        call_tests = call_tests + 1;
        if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
          xmlFreeDoc(pxVar11);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlDocDumpMemoryFormat",(ulong)(uint)(iVar7 - iVar6));
          iVar3 = iVar3 + 1;
          printf(" %d",(ulong)uVar4);
          printf(" %d",0);
          printf(" %d",uVar13);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar12;
        }
        uVar21 = uVar21 + 1;
        pxVar12 = (xmlDocPtr)(ulong)uVar21;
        puVar24 = puVar24 + 1;
      } while (uVar21 != 4);
      uVar13 = (ulong)(iVar5 + 1);
    } while (iVar5 == 0);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4);
  function_tests = function_tests + 1;
  uVar4 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    pxVar14 = gen_htmlDocPtr(uVar4,(int)in_RSI);
    htmlGetMetaEncoding(pxVar14);
    call_tests = call_tests + 1;
    if (((pxVar14 != (htmlDocPtr)0x0) && (api_doc != pxVar14)) && (pxVar14->doc != api_doc)) {
      xmlFreeDoc(pxVar14);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlGetMetaEncoding",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar4;
      printf(" %d");
      putchar(10);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 3);
  iVar2 = local_54 + iVar1 + iVar2 + local_3c;
  function_tests = function_tests + 1;
  puVar26 = &DAT_00159d60;
  uVar4 = 0;
  iVar1 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar4 < 4) {
      uVar20 = *puVar26;
    }
    else {
      uVar20 = 0;
    }
    htmlIsBooleanAttr(uVar20);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsBooleanAttr",(ulong)(uint)(iVar7 - iVar6));
      iVar1 = iVar1 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar4 = uVar4 + 1;
    puVar26 = puVar26 + 1;
  } while (uVar4 != 5);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar4 = 0;
  do {
    iVar7 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar4 < 4) {
        uVar20 = (&DAT_00159d60)[uVar4];
      }
      else {
        uVar20 = 0;
      }
      pxVar12 = (xmlDocPtr)htmlNewDoc(uVar20);
      if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDoc",(ulong)(uint)(iVar9 - iVar8));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar4);
        printf(" %d");
        putchar(10);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 5);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar4 = 0;
  do {
    puVar26 = &DAT_00159d60;
    uVar21 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar4 < 4) {
        uVar20 = (&DAT_00159d60)[uVar4];
      }
      else {
        uVar20 = 0;
      }
      if (uVar21 < 4) {
        pxVar12 = (xmlDocPtr)*puVar26;
      }
      else {
        pxVar12 = (xmlDocPtr)0x0;
      }
      pxVar11 = (xmlDocPtr)htmlNewDocNoDtD(uVar20);
      if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDocNoDtD",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar4);
        pxVar12 = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar21 != 5);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar4 = 0;
  do {
    uVar21 = 0;
    do {
      pxVar11 = (xmlDocPtr)0x0;
      do {
        iVar8 = (int)pxVar12;
        iVar9 = xmlMemBlocks();
        pxVar15 = gen_xmlBufferPtr(uVar4,iVar8);
        pxVar16 = gen_xmlDocPtr(uVar21,iVar8);
        iVar22 = (int)pxVar11;
        pxVar12 = (xmlDocPtr)gen_xmlNodePtr(iVar22,iVar8);
        htmlNodeDump(pxVar15,pxVar16,pxVar12);
        call_tests = call_tests + 1;
        iVar8 = extraout_EDX;
        if (pxVar15 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar15);
          iVar8 = extraout_EDX_00;
        }
        if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
          xmlFreeDoc(pxVar16);
          iVar8 = extraout_EDX_01;
        }
        des_xmlNodePtr(iVar22,(xmlNodePtr)pxVar12,iVar8);
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar9 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDump",(ulong)(uint)(iVar8 - iVar9));
          local_34 = local_34 + 1;
          printf(" %d",(ulong)uVar4);
          printf(" %d",(ulong)uVar21);
          printf(" %d");
          putchar(10);
          pxVar12 = pxVar11;
        }
        pxVar11 = (xmlDocPtr)(ulong)(iVar22 + 1U);
      } while (iVar22 + 1U != 3);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 3);
  function_tests = function_tests + 1;
  local_38 = 0;
  local_68 = 0;
  do {
    uVar4 = 0;
    do {
      pxVar11 = (xmlDocPtr)0x0;
      do {
        iVar9 = (int)pxVar12;
        iVar8 = xmlMemBlocks();
        if ((int)local_68 == 0) {
          iVar9 = 0x14bac0;
          pFVar17 = fopen64("test.out","a+");
        }
        else {
          pFVar17 = (FILE *)0x0;
        }
        pxVar16 = gen_xmlDocPtr(uVar4,iVar9);
        iVar22 = (int)pxVar11;
        pxVar12 = (xmlDocPtr)gen_xmlNodePtr(iVar22,iVar9);
        htmlNodeDumpFile(pFVar17,pxVar16,pxVar12);
        call_tests = call_tests + 1;
        iVar9 = extraout_EDX_02;
        if (pFVar17 != (FILE *)0x0) {
          fclose(pFVar17);
          iVar9 = extraout_EDX_03;
        }
        if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
          xmlFreeDoc(pxVar16);
          iVar9 = extraout_EDX_04;
        }
        des_xmlNodePtr(iVar22,(xmlNodePtr)pxVar12,iVar9);
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDumpFile",(ulong)(uint)(iVar9 - iVar8));
          local_38 = local_38 + 1;
          printf(" %d",local_68);
          printf(" %d",(ulong)uVar4);
          printf(" %d");
          putchar(10);
          pxVar12 = pxVar11;
        }
        pxVar11 = (xmlDocPtr)(ulong)(iVar22 + 1U);
      } while (iVar22 + 1U != 3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    bVar27 = (int)local_68 == 0;
    local_68 = (ulong)((int)local_68 + 1);
  } while (bVar27);
  function_tests = function_tests + 1;
  local_3c = 0;
  local_48 = 0;
  do {
    uVar4 = 0;
    do {
      uVar21 = 0;
      do {
        uVar10 = 0;
        do {
          pxVar11 = (xmlDocPtr)0x0;
          puVar24 = &DAT_00157254;
          do {
            iVar9 = (int)pxVar12;
            iVar8 = xmlMemBlocks();
            if ((int)local_48 == 0) {
              iVar9 = 0x14bac0;
              pFVar17 = fopen64("test.out","a+");
            }
            else {
              pFVar17 = (FILE *)0x0;
            }
            pxVar16 = gen_xmlDocPtr(uVar4,iVar9);
            pxVar12 = (xmlDocPtr)gen_xmlNodePtr(uVar21,iVar9);
            if (uVar10 < 3) {
              uVar20 = (&DAT_00159d48)[uVar10];
            }
            else {
              uVar20 = 0;
            }
            uVar19 = 0xffffffff;
            uVar25 = (uint)pxVar11;
            if (uVar25 < 4) {
              uVar19 = *puVar24;
            }
            htmlNodeDumpFileFormat(pFVar17,pxVar16,pxVar12,uVar20,uVar19);
            call_tests = call_tests + 1;
            iVar9 = extraout_EDX_05;
            if (pFVar17 != (FILE *)0x0) {
              fclose(pFVar17);
              iVar9 = extraout_EDX_06;
            }
            if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc))
            {
              xmlFreeDoc(pxVar16);
              iVar9 = extraout_EDX_07;
            }
            des_xmlNodePtr(uVar21,(xmlNodePtr)pxVar12,iVar9);
            xmlResetLastError();
            iVar9 = xmlMemBlocks();
            if (iVar8 != iVar9) {
              iVar9 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlNodeDumpFileFormat",
                     (ulong)(uint)(iVar9 - iVar8));
              local_3c = local_3c + 1;
              printf(" %d",local_48);
              printf(" %d",(ulong)uVar4);
              printf(" %d",(ulong)uVar21);
              printf(" %d",(ulong)uVar10);
              printf(" %d");
              putchar(10);
              pxVar12 = pxVar11;
            }
            uVar25 = uVar25 + 1;
            pxVar11 = (xmlDocPtr)(ulong)uVar25;
            puVar24 = puVar24 + 1;
          } while (uVar25 != 4);
          uVar10 = uVar10 + 1;
        } while (uVar10 != 4);
        uVar21 = uVar21 + 1;
      } while (uVar21 != 3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    bVar27 = (int)local_48 == 0;
    local_48 = (ulong)((int)local_48 + 1);
  } while (bVar27);
  function_tests = function_tests + 1;
  iVar1 = iVar2 + iVar3 + iVar5 + iVar1 + iVar6 + iVar7 + local_34;
  local_34 = 0;
  local_48 = 0;
  do {
    uVar4 = 0;
    do {
      iVar2 = 0;
      do {
        uVar13 = 0;
        do {
          pxVar11 = (xmlDocPtr)0x0;
          puVar24 = &DAT_00157254;
          do {
            iVar5 = (int)pxVar12;
            iVar3 = xmlMemBlocks();
            if ((int)local_48 == 0) {
              iVar5 = 0;
              lVar18 = xmlOutputBufferCreateFilename("test.out",0,0);
            }
            else {
              lVar18 = 0;
            }
            pxVar16 = gen_xmlDocPtr(uVar4,iVar5);
            pxVar12 = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar5);
            if ((uint)uVar13 < 3) {
              uVar20 = (&DAT_00159d48)[uVar13];
            }
            else {
              uVar20 = 0;
            }
            uVar19 = 0xffffffff;
            uVar21 = (uint)pxVar11;
            if (uVar21 < 4) {
              uVar19 = *puVar24;
            }
            htmlNodeDumpFormatOutput(lVar18,pxVar16,pxVar12,uVar20,uVar19);
            call_tests = call_tests + 1;
            iVar5 = extraout_EDX_08;
            if (lVar18 != 0) {
              xmlOutputBufferClose(lVar18);
              iVar5 = extraout_EDX_09;
            }
            if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc))
            {
              xmlFreeDoc(pxVar16);
              iVar5 = extraout_EDX_10;
            }
            des_xmlNodePtr(iVar2,(xmlNodePtr)pxVar12,iVar5);
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar3 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlNodeDumpFormatOutput",
                     (ulong)(uint)(iVar5 - iVar3));
              local_34 = local_34 + 1;
              printf(" %d",local_48);
              printf(" %d",(ulong)uVar4);
              printf(" %d",iVar2);
              printf(" %d",uVar13);
              printf(" %d");
              putchar(10);
              pxVar12 = pxVar11;
            }
            uVar21 = uVar21 + 1;
            pxVar11 = (xmlDocPtr)(ulong)uVar21;
            puVar24 = puVar24 + 1;
          } while (uVar21 != 4);
          uVar21 = (uint)uVar13 + 1;
          uVar13 = (ulong)uVar21;
        } while (uVar21 != 4);
        iVar2 = iVar2 + 1;
      } while (iVar2 != 3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    bVar27 = (int)local_48 == 0;
    local_48 = (ulong)((int)local_48 + 1);
  } while (bVar27);
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_50 = 0;
  do {
    uVar4 = 0;
    do {
      uVar21 = 0;
      do {
        puVar26 = &DAT_00159d48;
        pxVar11 = (xmlDocPtr)0x0;
        do {
          iVar5 = (int)pxVar12;
          iVar3 = xmlMemBlocks();
          if ((int)local_50 == 0) {
            iVar5 = 0;
            lVar18 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            lVar18 = 0;
          }
          pxVar16 = gen_xmlDocPtr(uVar4,iVar5);
          pxVar12 = (xmlDocPtr)gen_xmlNodePtr(uVar21,iVar5);
          uVar10 = (uint)pxVar11;
          if (uVar10 < 3) {
            uVar20 = *puVar26;
          }
          else {
            uVar20 = 0;
          }
          htmlNodeDumpOutput(lVar18,pxVar16,pxVar12,uVar20);
          call_tests = call_tests + 1;
          iVar5 = extraout_EDX_11;
          if (lVar18 != 0) {
            xmlOutputBufferClose(lVar18);
            iVar5 = extraout_EDX_12;
          }
          if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
            xmlFreeDoc(pxVar16);
            iVar5 = extraout_EDX_13;
          }
          des_xmlNodePtr(uVar21,(xmlNodePtr)pxVar12,iVar5);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar3 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlNodeDumpOutput",(ulong)(uint)(iVar5 - iVar3));
            iVar2 = iVar2 + 1;
            printf(" %d",local_50);
            printf(" %d",(ulong)uVar4);
            printf(" %d",(ulong)uVar21);
            printf(" %d");
            putchar(10);
            pxVar12 = pxVar11;
          }
          uVar10 = uVar10 + 1;
          pxVar11 = (xmlDocPtr)(ulong)uVar10;
          puVar26 = puVar26 + 1;
        } while (uVar10 != 4);
        uVar21 = uVar21 + 1;
      } while (uVar21 != 3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
    bVar27 = (int)local_50 == 0;
    local_50 = (ulong)((int)local_50 + 1);
  } while (bVar27);
  iVar1 = iVar1 + local_38 + local_3c;
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar4 = 0;
  do {
    uVar21 = 0;
    do {
      iVar5 = (int)pxVar12;
      iVar3 = xmlMemBlocks();
      if (uVar4 < 5) {
        puVar23 = (&PTR_anon_var_dwarf_682_00159d20)[uVar4];
      }
      else {
        puVar23 = (undefined *)0x0;
      }
      pxVar11 = gen_xmlDocPtr(uVar21,iVar5);
      pxVar12 = pxVar11;
      htmlSaveFile(puVar23);
      call_tests = call_tests + 1;
      if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
        xmlFreeDoc(pxVar11);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar3 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSaveFile",(ulong)(uint)(iVar5 - iVar3));
        local_38 = local_38 + 1;
        printf(" %d",(ulong)uVar4);
        pxVar12 = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar4 = 0;
  do {
    uVar21 = 0;
    do {
      pxVar11 = (xmlDocPtr)0x0;
      puVar26 = &DAT_00159d48;
      do {
        iVar5 = (int)pxVar12;
        iVar3 = xmlMemBlocks();
        if (uVar4 < 5) {
          puVar23 = (&PTR_anon_var_dwarf_682_00159d20)[uVar4];
        }
        else {
          puVar23 = (undefined *)0x0;
        }
        pxVar16 = gen_xmlDocPtr(uVar21,iVar5);
        uVar10 = (uint)pxVar11;
        if (uVar10 < 3) {
          uVar20 = *puVar26;
        }
        else {
          uVar20 = 0;
        }
        pxVar12 = pxVar16;
        htmlSaveFileEnc(puVar23,pxVar16,uVar20);
        call_tests = call_tests + 1;
        if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
          xmlFreeDoc(pxVar16);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar3 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSaveFileEnc",(ulong)(uint)(iVar5 - iVar3));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar4);
          printf(" %d",(ulong)uVar21);
          printf(" %d");
          putchar(10);
          pxVar12 = pxVar11;
        }
        uVar10 = uVar10 + 1;
        pxVar11 = (xmlDocPtr)(ulong)uVar10;
        puVar26 = puVar26 + 1;
      } while (uVar10 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar4 = 0;
  do {
    uVar21 = 0;
    do {
      uVar10 = 0;
      do {
        puVar24 = &DAT_00157254;
        pxVar11 = (xmlDocPtr)0x0;
        do {
          iVar6 = (int)pxVar12;
          iVar5 = xmlMemBlocks();
          if (uVar4 < 5) {
            puVar23 = (&PTR_anon_var_dwarf_682_00159d20)[uVar4];
          }
          else {
            puVar23 = (undefined *)0x0;
          }
          pxVar16 = gen_xmlDocPtr(uVar21,iVar6);
          if (uVar10 < 3) {
            uVar20 = (&DAT_00159d48)[uVar10];
          }
          else {
            uVar20 = 0;
          }
          uVar19 = 0xffffffff;
          uVar25 = (uint)pxVar11;
          if (uVar25 < 4) {
            uVar19 = *puVar24;
          }
          pxVar12 = pxVar16;
          htmlSaveFileFormat(puVar23,pxVar16,uVar20,uVar19);
          call_tests = call_tests + 1;
          if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
            xmlFreeDoc(pxVar16);
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlSaveFileFormat",(ulong)(uint)(iVar6 - iVar5));
            iVar3 = iVar3 + 1;
            printf(" %d",(ulong)uVar4);
            printf(" %d",(ulong)uVar21);
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            pxVar12 = pxVar11;
          }
          uVar25 = uVar25 + 1;
          pxVar11 = (xmlDocPtr)(ulong)uVar25;
          puVar24 = puVar24 + 1;
        } while (uVar25 != 4);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar4 = 0;
  do {
    puVar26 = &DAT_00159d60;
    pxVar11 = (xmlDocPtr)0x0;
    do {
      iVar7 = (int)pxVar12;
      iVar6 = xmlMemBlocks();
      pxVar14 = gen_htmlDocPtr(uVar4,iVar7);
      uVar21 = (uint)pxVar11;
      if (uVar21 < 4) {
        pxVar12 = (xmlDocPtr)*puVar26;
      }
      else {
        pxVar12 = (xmlDocPtr)0x0;
      }
      htmlSetMetaEncoding(pxVar14);
      call_tests = call_tests + 1;
      if (((pxVar14 != (htmlDocPtr)0x0) && (api_doc != pxVar14)) && (pxVar14->doc != api_doc)) {
        xmlFreeDoc(pxVar14);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSetMetaEncoding",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar4);
        printf(" %d");
        putchar(10);
        pxVar12 = pxVar11;
      }
      uVar21 = uVar21 + 1;
      pxVar11 = (xmlDocPtr)(ulong)uVar21;
      puVar26 = puVar26 + 1;
    } while (uVar21 != 5);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 3);
  function_tests = function_tests + 1;
  uVar4 = iVar1 + local_34 + iVar2 + local_38 + local_3c + iVar3 + iVar5;
  if (uVar4 != 0) {
    printf("Module HTMLtree: %d errors\n",(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

static int
test_HTMLtree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLtree : 18 of 18 functions ...\n");
    test_ret += test_htmlDocContentDumpFormatOutput();
    test_ret += test_htmlDocContentDumpOutput();
    test_ret += test_htmlDocDump();
    test_ret += test_htmlDocDumpMemory();
    test_ret += test_htmlDocDumpMemoryFormat();
    test_ret += test_htmlGetMetaEncoding();
    test_ret += test_htmlIsBooleanAttr();
    test_ret += test_htmlNewDoc();
    test_ret += test_htmlNewDocNoDtD();
    test_ret += test_htmlNodeDump();
    test_ret += test_htmlNodeDumpFile();
    test_ret += test_htmlNodeDumpFileFormat();
    test_ret += test_htmlNodeDumpFormatOutput();
    test_ret += test_htmlNodeDumpOutput();
    test_ret += test_htmlSaveFile();
    test_ret += test_htmlSaveFileEnc();
    test_ret += test_htmlSaveFileFormat();
    test_ret += test_htmlSetMetaEncoding();

    if (test_ret != 0)
	printf("Module HTMLtree: %d errors\n", test_ret);
    return(test_ret);
}